

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flic.cc
# Opt level: O3

void __thiscall Flic::readLc(Flic *this,FlicHeader *header,FlicFrame *frame,istream *is)

{
  int iVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  ushort local_3c;
  short local_3a;
  int local_38;
  uint16_t lines;
  int16_t lineSkip;
  uint8_t pixelSkip;
  char count;
  ulong __n;
  
  uVar6 = (uint)(header->depth >> 3);
  __n = (ulong)uVar6;
  memcpy(frame->pixels,
         (this->frames_).super__Vector_base<FlicFrame,_std::allocator<FlicFrame>_>._M_impl.
         super__Vector_impl_data._M_finish[-1].pixels,
         (ulong)((uint)header->height * (uint)header->width * uVar6));
  std::istream::read((char *)is,(long)&local_3c);
  if (local_3c != 0) {
    iVar11 = 0;
    uVar8 = 0;
    do {
      std::istream::read((char *)is,(long)&local_3a);
      iVar1 = (int)local_3a;
      if (local_3a < 0) {
        uVar8 = uVar8 - iVar1;
      }
      else {
        if (local_3a != 0) {
          iVar3 = 0;
          iVar7 = 0;
          do {
            std::istream::read((char *)is,(long)&lineSkip);
            iVar7 = (uint)(byte)lineSkip + iVar7;
            iVar4 = (uint)header->width * ((uint)header->height + ~uVar8) + iVar7;
            std::istream::read((char *)is,(long)&lineSkip + 1);
            if (lineSkip._1_1_ < '\0') {
              local_38 = iVar7;
              pvVar2 = operator_new__(__n);
              std::istream::read((char *)is,(long)pvVar2);
              iVar7 = (int)lineSkip._1_1_;
              if (lineSkip._1_1_ < '\0') {
                lVar9 = (long)(int)(iVar4 * uVar6);
                lVar5 = 0;
                do {
                  memcpy(frame->pixels + lVar9,pvVar2,__n);
                  lVar5 = lVar5 + 1;
                  iVar7 = (int)lineSkip._1_1_;
                  lVar9 = lVar9 + __n;
                } while (SBORROW8(lVar5,-(long)iVar7) != lVar5 + iVar7 < 0);
              }
              iVar7 = local_38 - iVar7;
              operator_delete(pvVar2);
            }
            else {
              if (lineSkip._1_1_ == '\0') {
                lVar9 = 0;
              }
              else {
                lVar5 = (long)(int)(iVar4 * uVar6);
                lVar10 = 0;
                local_38 = iVar7;
                do {
                  pvVar2 = operator_new__(__n);
                  std::istream::read((char *)is,(long)pvVar2);
                  memcpy(frame->pixels + lVar5,pvVar2,__n);
                  operator_delete(pvVar2);
                  lVar10 = lVar10 + 1;
                  lVar9 = (long)lineSkip._1_1_;
                  lVar5 = lVar5 + __n;
                  iVar7 = local_38;
                } while (lVar10 < lVar9);
              }
              iVar7 = (int)lVar9 + iVar7;
            }
            iVar3 = iVar3 + 1;
          } while (iVar3 != iVar1);
        }
        uVar8 = uVar8 + 1;
        iVar11 = iVar11 + 1;
      }
    } while (iVar11 < (int)(uint)local_3c);
  }
  return;
}

Assistant:

void Flic::readLc(const FlicHeader &header, FlicFrame &frame, std::istream &is) {
	int bytespp = header.depth / 8;
	memcpy(frame.pixels, frames_.back().pixels, header.width * header.height * bytespp);
	uint16_t lines;
	is.read((char*)&lines, 2);
	int j = 0, y = 0;
	while (j < lines) {
		int16_t lineSkip;
		is.read(reinterpret_cast<char*>(&lineSkip), 2);
		if (lineSkip < 0) {
			y += -lineSkip;
			continue;
		} else {
			int packets = lineSkip;
			int x = 0;
			for (int k = 0; k < packets; ++k) {
				uint8_t pixelSkip;
				is.read((char*)&pixelSkip, 1);
				x += pixelSkip;
				int offset = ((header.height - y - 1) * header.width + x) * bytespp;
				char count;
				is.read(&count, 1);
				if (count < 0) {
					char *tmp = new char[bytespp];
					is.read(tmp, bytespp);
					for (int j = 0; j < -count; ++j) {
						memcpy(frame.pixels + offset + j * bytespp, tmp, bytespp);
					}
					x += -count;
					delete tmp;
				} else {
					for (int j = 0; j < count; ++j) {
						char *tmp = new char[bytespp];
						is.read(tmp, bytespp);
						memcpy(frame.pixels + offset + j * bytespp, tmp, bytespp);
						delete tmp;
					}
					x += count;
				}
			}
			++y;
		}
		++j;
	}
}